

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedGroundCombatSoldier.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GED_EnhancedGroundCombatSoldier::Encode
          (GED_EnhancedGroundCombatSoldier *this,KDataStream *stream)

{
  GED_BasicGroundCombatSoldier::Encode(&this->super_GED_BasicGroundCombatSoldier,stream);
  KDataStream::Write(stream,this->m_ui8WaterStatus);
  KDataStream::Write(stream,this->m_ui8RestStatus);
  KDataStream::Write(stream,this->m_ui8PriAmmun);
  KDataStream::Write(stream,this->m_ui8SecAmmun);
  return;
}

Assistant:

void GED_EnhancedGroundCombatSoldier::Encode( KDataStream & stream ) const
{
    GED_BasicGroundCombatSoldier::Encode( stream );

    stream << m_ui8WaterStatus
           << m_ui8RestStatus
           << m_ui8PriAmmun
           << m_ui8SecAmmun;
}